

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

Parameters * __thiscall
minja::Parser::parseParameters_abi_cxx11_(Parameters *__return_storage_ptr__,Parser *this)

{
  pointer pcVar1;
  char *pcVar2;
  size_type sVar3;
  size_type sVar4;
  int iVar5;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  runtime_error *prVar8;
  char *pcVar9;
  Parameters *result;
  shared_ptr<minja::Expression> value;
  shared_ptr<minja::Expression> expr;
  string local_90;
  vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
  *local_70;
  undefined1 local_68 [32];
  CharIterator local_48;
  shared_ptr<minja::Expression> local_40;
  
  pcVar2 = (this->end)._M_current;
  pcVar9 = (this->it)._M_current;
  local_70 = (vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
              *)__return_storage_ptr__;
  while ((pcVar9 != pcVar2 && (iVar5 = isspace((int)*pcVar9), iVar5 != 0))) {
    pcVar9 = pcVar9 + 1;
    (this->it)._M_current = pcVar9;
  }
  pcVar1 = local_68 + 0x10;
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"(","");
  consumeToken(&local_90,this,(string *)local_68,Strip);
  sVar3 = local_90._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if (sVar3 == 0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Expected opening parenthesis in param list");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined8 *)local_70 = 0;
  *(pointer *)(local_70 + 8) = (pointer)0x0;
  *(pointer *)(local_70 + 0x10) = (pointer)0x0;
  local_48._M_current = (char *)0x0;
  do {
    if ((this->it)._M_current == (this->end)._M_current) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"Expected closing parenthesis in call args");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_68._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,")","");
    consumeToken(&local_90,this,(string *)local_68,Strip);
    sVar3 = local_90._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if ((pointer)local_68._0_8_ != pcVar1) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if (sVar3 != 0) {
      return (Parameters *)local_70;
    }
    parseExpression((Parser *)&local_40,SUB81(this,0));
    if ((element_type *)
        local_40.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"Expected expression in call args");
      goto LAB_001e91d1;
    }
    lVar6 = __dynamic_cast(local_40.
                           super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &Expression::typeinfo,&VariableExpr::typeinfo,0);
    if (lVar6 == 0) {
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::
      vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
      ::emplace_back<std::__cxx11::string,std::shared_ptr<minja::Expression>>
                (local_70,&local_90,&local_40);
LAB_001e8ffc:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      local_68._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"=","");
      consumeToken(&local_90,this,(string *)local_68,Strip);
      sVar3 = local_90._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      if ((pointer)local_68._0_8_ != pcVar1) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      if (sVar3 == 0) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,*(long *)(lVar6 + 0x20),
                   *(long *)(lVar6 + 0x28) + *(long *)(lVar6 + 0x20));
        local_68._0_8_ = (pointer)0x0;
        std::
        vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
        ::emplace_back<std::__cxx11::string,decltype(nullptr)>(local_70,&local_90,(void **)local_68)
        ;
        goto LAB_001e8ffc;
      }
      parseExpression((Parser *)local_68,SUB81(this,0));
      if ((pointer)local_68._0_8_ == (pointer)0x0) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"Expected expression in for named arg");
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,*(long *)(lVar6 + 0x20),
                 *(long *)(lVar6 + 0x28) + *(long *)(lVar6 + 0x20));
      std::
      vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
      ::emplace_back<std::__cxx11::string,std::shared_ptr<minja::Expression>>
                (local_70,&local_90,(shared_ptr<minja::Expression> *)local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
    }
    local_68._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,",","");
    consumeToken(&local_90,this,(string *)local_68,Strip);
    sVar3 = local_90._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if ((pointer)local_68._0_8_ != pcVar1) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if (sVar3 == 0) {
      local_68._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,")","");
      consumeToken(&local_90,this,(string *)local_68,Strip);
      sVar4 = local_90._M_string_length;
      paVar7 = &local_90.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar7) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
        paVar7 = extraout_RAX;
      }
      if ((pointer)local_68._0_8_ != pcVar1) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        paVar7 = extraout_RAX_00;
      }
      local_48._M_current = (char *)CONCAT71((int7)((ulong)paVar7 >> 8),1);
      if (sVar4 == 0) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"Expected closing parenthesis in call args");
LAB_001e91d1:
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if (local_40.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (sVar3 == 0) {
      if (((ulong)local_48._M_current & 1) == 0) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                   *)local_70);
      }
      return (Parameters *)local_70;
    }
  } while( true );
}

Assistant:

Expression::Parameters parseParameters() {
        consumeSpaces();
        if (consumeToken("(").empty()) throw std::runtime_error("Expected opening parenthesis in param list");

        Expression::Parameters result;

        while (it != end) {
            if (!consumeToken(")").empty()) {
                return result;
            }
            auto expr = parseExpression();
            if (!expr) throw std::runtime_error("Expected expression in call args");

            if (auto ident = dynamic_cast<VariableExpr*>(expr.get())) {
                if (!consumeToken("=").empty()) {
                    auto value = parseExpression();
                    if (!value) throw std::runtime_error("Expected expression in for named arg");
                    result.emplace_back(ident->get_name(), std::move(value));
                } else {
                    result.emplace_back(ident->get_name(), nullptr);
                }
            } else {
                result.emplace_back(std::string(), std::move(expr));
            }
            if (consumeToken(",").empty()) {
              if (consumeToken(")").empty()) {
                throw std::runtime_error("Expected closing parenthesis in call args");
              }
              return result;
            }
        }
        throw std::runtime_error("Expected closing parenthesis in call args");
    }